

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salsa_file_wrapper.cpp
# Opt level: O0

void __thiscall
salsa_file_wrapper::crypt_file
          (salsa_file_wrapper *this,string *in_file_name,string *out_file_name,bool print_process)

{
  bool bVar1;
  byte bVar2;
  runtime_error *prVar3;
  pointer psVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  streamoff sVar8;
  ostream *poVar9;
  undefined1 auVar10 [16];
  allocator<char> local_541;
  string local_540 [32];
  size_type local_520;
  size_t i;
  undefined8 local_510;
  iterator local_508;
  value_type_conflict1 *v;
  iterator __end3;
  iterator __begin3;
  block_array *__range3;
  block_array crypt;
  size_type tail_size;
  undefined8 local_490;
  uint local_484;
  undefined1 local_480 [4];
  uint32_t file_length;
  block_array file_block;
  ofstream out_file;
  char local_240 [8];
  ifstream input_file;
  bool print_process_local;
  string *out_file_name_local;
  string *in_file_name_local;
  salsa_file_wrapper *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
  if (!bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"create crypter firstly");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ifstream::ifstream(local_240,in_file_name,8);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) != 0) {
    std::ofstream::ofstream(file_block._M_elems + 0x38,out_file_name,0x10);
    bVar2 = std::ofstream::is_open();
    if ((bVar2 & 1) != 0) {
      psVar4 = std::unique_ptr<salsa20,_std::default_delete<salsa20>_>::operator->
                         (&this->m_cryptoman);
      salsa20::begin_crypt(psVar4);
      std::istream::seekg((long)local_240,_S_beg);
      auVar10 = std::istream::tellg();
      local_490 = auVar10._8_8_;
      tail_size = auVar10._0_8_;
      uVar5 = std::fpos::operator_cast_to_long((fpos *)&tail_size);
      local_484 = (uint)uVar5;
      sVar6 = std::array<unsigned_char,_64UL>::size((array<unsigned_char,_64UL> *)local_480);
      register0x00000010 = (uVar5 & 0xffffffff) % sVar6;
      std::istream::seekg((long)local_240,_S_beg);
      while (bVar2 = std::ios::good(), (bVar2 & 1) != 0) {
        crypt._M_elems[0x38] = '\0';
        std::array<unsigned_char,_64UL>::fill
                  ((array<unsigned_char,_64UL> *)local_480,crypt._M_elems + 0x38);
        pvVar7 = std::array<unsigned_char,_64UL>::operator[]
                           ((array<unsigned_char,_64UL> *)local_480,0);
        std::array<unsigned_char,_64UL>::size((array<unsigned_char,_64UL> *)local_480);
        std::istream::read(local_240,(long)pvVar7);
        psVar4 = std::unique_ptr<salsa20,_std::default_delete<salsa20>_>::operator->
                           (&this->m_cryptoman);
        salsa20::process_block((block_array *)((long)&__range3 + 7),psVar4,(block_array *)local_480)
        ;
        bVar2 = std::ios::good();
        if ((bVar2 & 1) == 0) {
          for (local_520 = 0; local_520 < stack0xfffffffffffffb60; local_520 = local_520 + 1) {
            std::array<unsigned_char,_64UL>::at
                      ((array<unsigned_char,_64UL> *)((long)&__range3 + 7),local_520);
            std::ostream::put((char)&file_block + '8');
          }
          if (print_process) {
            poVar9 = std::operator<<((ostream *)&std::cout,"\rfinish");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(local_540,0x32,' ',&local_541);
            std::operator<<(poVar9,local_540);
            std::__cxx11::string::~string(local_540);
            std::allocator<char>::~allocator(&local_541);
          }
        }
        else {
          __begin3 = (iterator)((long)&__range3 + 7);
          __end3 = std::array<unsigned_char,_64UL>::begin((array<unsigned_char,_64UL> *)__begin3);
          v = std::array<unsigned_char,_64UL>::end((array<unsigned_char,_64UL> *)__begin3);
          for (; __end3 != v; __end3 = __end3 + 1) {
            local_508 = __end3;
            std::ostream::put((char)&file_block + '8');
          }
          if (print_process) {
            poVar9 = std::operator<<((ostream *)&std::cout,"\r");
            poVar9 = std::operator<<(poVar9,"progress: ");
            auVar10 = std::istream::tellg();
            local_510 = auVar10._8_8_;
            i = auVar10._0_8_;
            sVar8 = std::fpos::operator_cast_to_long((fpos *)&i);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar8);
            poVar9 = std::operator<<(poVar9," / ");
            std::ostream::operator<<(poVar9,local_484);
          }
        }
      }
      std::ifstream::close();
      std::ofstream::close();
      std::ofstream::~ofstream(file_block._M_elems + 0x38);
      std::ifstream::~ifstream(local_240);
      return;
    }
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"output file not open");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"input file not open");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void salsa_file_wrapper::crypt_file(const std::string &in_file_name, const std::string &out_file_name, bool print_process)
{
    if (!m_cryptoman)
        throw std::runtime_error("create crypter firstly");

    std::ifstream input_file(in_file_name);
    if (!input_file.is_open())
        throw std::runtime_error("input file not open");

    std::ofstream out_file(out_file_name);
    if (!out_file.is_open())
        throw std::runtime_error("output file not open");

    // reset chiper
    m_cryptoman->begin_crypt();

    salsa20::block_array file_block;

    input_file.seekg (0, std::ios::end);
    uint32_t file_length = static_cast<uint32_t>(input_file.tellg());
    auto tail_size = file_length % file_block.size();
    input_file.seekg (0, std::ios::beg);

    while (input_file.good())
    {
        // clear block buffer
        file_block.fill(0x0);

        // read next data block
        input_file.read(reinterpret_cast<char *>(&file_block[0]), file_block.size());

        // encrypt block
        auto crypt = m_cryptoman->process_block(file_block);

        // copy encrypt data to out file
        if (input_file.good())
        {
            for (const auto &v : crypt)
                out_file.put(static_cast<char>(v));

            if (print_process)
                std::cout << "\r" << "progress: " << input_file.tellg() << " / " << file_length;
        }
        else
        {
            for (size_t i = 0; i < tail_size; ++i)
                out_file.put(static_cast<char>(crypt.at(i)));

            if (print_process)
                std::cout << "\rfinish" << std::string(50, ' ');
        }

    }

    // close files
    input_file.close();
    out_file.close();
}